

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O3

int AF_AActor_A_CustomRailgun
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  AActor *pAVar1;
  double dVar2;
  PClass *pPVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  undefined4 extraout_var;
  VMValue *pVVar8;
  AActor *pAVar9;
  AActor *other;
  uint uVar10;
  char *pcVar11;
  int iVar12;
  int iVar13;
  bool bVar14;
  ulong uVar15;
  ulong uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined8 local_148;
  undefined1 local_140 [16];
  DAngle DStack_130;
  double local_120;
  double local_118;
  double local_110;
  ulong local_108;
  undefined8 uStack_100;
  undefined1 local_f8 [16];
  double local_e8;
  double dStack_e0;
  FTranslatedLineTarget t;
  DVector2 xydiff;
  PClass *pPVar7;
  
  pPVar3 = AActor::RegistrationInfo.MyClass;
  DStack_130.Degrees = (double)local_140._8_8_;
  if (numparam < 1) {
    pcVar11 = "(paramnum) < numparam";
    goto LAB_003d0685;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_003d0637:
    pcVar11 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003d0685:
    __assert_fail(pcVar11,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x8cd,
                  "int AF_AActor_A_CustomRailgun(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  other = *(AActor **)&param->field_0;
  if ((param->field_0).field_1.atag == 1) {
    if (other == (AActor *)0x0) goto LAB_003cfbfc;
    pPVar7 = (other->super_DThinker).super_DObject.Class;
    if (pPVar7 == (PClass *)0x0) {
      iVar4 = (**(other->super_DThinker).super_DObject._vptr_DObject)(other);
      pPVar7 = (PClass *)CONCAT44(extraout_var,iVar4);
      (other->super_DThinker).super_DObject.Class = pPVar7;
    }
    bVar14 = pPVar7 != (PClass *)0x0;
    if (pPVar7 != pPVar3 && bVar14) {
      do {
        pPVar7 = pPVar7->ParentClass;
        bVar14 = pPVar7 != (PClass *)0x0;
        if (pPVar7 == pPVar3) break;
      } while (pPVar7 != (PClass *)0x0);
    }
    if (!bVar14) {
      pcVar11 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003d0685;
    }
  }
  else {
    if (other != (AActor *)0x0) goto LAB_003d0637;
LAB_003cfbfc:
    other = (AActor *)0x0;
  }
  if (numparam == 1) {
    pcVar11 = "(paramnum) < numparam";
LAB_003d06ad:
    __assert_fail(pcVar11,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x8ce,
                  "int AF_AActor_A_CustomRailgun(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if (param[1].field_0.field_3.Type != '\0') {
    pcVar11 = "param[paramnum].Type == REGT_INT";
    goto LAB_003d06ad;
  }
  iVar4 = param[1].field_0.i;
  if (numparam < 3) {
    pVVar8 = defaultparam->Array;
    if (pVVar8[2].field_0.field_3.Type != '\0') {
      pcVar11 = "(defaultparam[paramnum]).Type == REGT_INT";
      goto LAB_003d0871;
    }
    iVar12 = pVVar8[2].field_0.i;
LAB_003cfc49:
    if (pVVar8[3].field_0.field_3.Type != '\0') {
      pcVar11 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003d0890:
      __assert_fail(pcVar11,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x8d0,
                    "int AF_AActor_A_CustomRailgun(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
LAB_003cfc56:
    if (pVVar8[4].field_0.field_3.Type != '\0') {
      pcVar11 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003d0840:
      __assert_fail(pcVar11,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x8d1,
                    "int AF_AActor_A_CustomRailgun(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
LAB_003cfc64:
    if (pVVar8[5].field_0.field_3.Type != '\0') {
      pcVar11 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003d0821:
      __assert_fail(pcVar11,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x8d2,
                    "int AF_AActor_A_CustomRailgun(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    uVar10 = pVVar8[5].field_0.i;
LAB_003cfc71:
    if (pVVar8[6].field_0.field_3.Type != '\0') {
      pcVar11 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003d0802:
      __assert_fail(pcVar11,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x8d3,
                    "int AF_AActor_A_CustomRailgun(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    iVar13 = pVVar8[6].field_0.i;
LAB_003cfc7f:
    if (pVVar8[7].field_0.field_3.Type != '\x01') {
      pcVar11 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_003d07e3:
      __assert_fail(pcVar11,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x8d4,
                    "int AF_AActor_A_CustomRailgun(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
LAB_003cfc8e:
    if ((pVVar8[8].field_0.field_3.Type != '\x03') ||
       ((pVVar8[8].field_0.field_1.atag != 1 && (pVVar8[8].field_0.field_1.a != (void *)0x0)))) {
      pcVar11 = 
      "(defaultparam[paramnum]).Type == REGT_POINTER && ((defaultparam[paramnum]).atag == ATAG_OBJECT || (defaultparam[paramnum]).a == nullptr)"
      ;
LAB_003d0666:
      __assert_fail(pcVar11,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x8d5,
                    "int AF_AActor_A_CustomRailgun(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
LAB_003cfcb7:
    if (pVVar8[9].field_0.field_3.Type != '\x01') {
      pcVar11 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_003d07c4:
      __assert_fail(pcVar11,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x8d6,
                    "int AF_AActor_A_CustomRailgun(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
LAB_003cfccc:
    if (pVVar8[10].field_0.field_3.Type != '\x01') {
      pcVar11 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_003d07a5:
      __assert_fail(pcVar11,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x8d7,
                    "int AF_AActor_A_CustomRailgun(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
LAB_003cfce1:
    if (pVVar8[0xb].field_0.field_3.Type != '\x01') {
      pcVar11 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_003d0786:
      __assert_fail(pcVar11,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x8d8,
                    "int AF_AActor_A_CustomRailgun(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    uVar17 = (undefined4)*(undefined8 *)&pVVar8[0xb].field_0;
    uVar18 = (undefined4)((ulong)*(undefined8 *)&pVVar8[0xb].field_0 >> 0x20);
LAB_003cfcf6:
    if (pVVar8[0xc].field_0.field_3.Type != '\0') {
      pcVar11 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003d0767:
      __assert_fail(pcVar11,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x8d9,
                    "int AF_AActor_A_CustomRailgun(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
LAB_003cfd09:
    if (pVVar8[0xd].field_0.field_3.Type != '\x01') {
      pcVar11 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_003d0748:
      __assert_fail(pcVar11,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x8da,
                    "int AF_AActor_A_CustomRailgun(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    uVar19 = (undefined4)*(undefined8 *)&pVVar8[0xd].field_0;
    uVar20 = (undefined4)((ulong)*(undefined8 *)&pVVar8[0xd].field_0 >> 0x20);
LAB_003cfd1e:
    if (pVVar8[0xe].field_0.field_3.Type != '\x01') {
      pcVar11 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_003d0729:
      __assert_fail(pcVar11,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x8db,
                    "int AF_AActor_A_CustomRailgun(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
LAB_003cfd33:
    if ((pVVar8[0xf].field_0.field_3.Type != '\x03') ||
       ((pVVar8[0xf].field_0.field_1.atag != 1 && (pVVar8[0xf].field_0.field_1.a != (void *)0x0))))
    {
      pcVar11 = 
      "(defaultparam[paramnum]).Type == REGT_POINTER && ((defaultparam[paramnum]).atag == ATAG_OBJECT || (defaultparam[paramnum]).a == nullptr)"
      ;
LAB_003d0647:
      __assert_fail(pcVar11,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x8dc,
                    "int AF_AActor_A_CustomRailgun(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
LAB_003cfd5c:
    if (pVVar8[0x10].field_0.field_3.Type != '\x01') {
      pcVar11 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_003d070a:
      __assert_fail(pcVar11,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x8dd,
                    "int AF_AActor_A_CustomRailgun(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
LAB_003cfd71:
    if (pVVar8[0x11].field_0.field_3.Type != '\0') {
      pcVar11 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003d06eb:
      __assert_fail(pcVar11,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x8de,
                    "int AF_AActor_A_CustomRailgun(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
LAB_003cfd85:
    if (pVVar8[0x12].field_0.field_3.Type != '\0') {
      pcVar11 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003d06cc:
      __assert_fail(pcVar11,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x8df,
                    "int AF_AActor_A_CustomRailgun(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
  }
  else {
    if (param[2].field_0.field_3.Type != '\0') {
      pcVar11 = "(param[paramnum]).Type == REGT_INT";
LAB_003d0871:
      __assert_fail(pcVar11,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x8cf,
                    "int AF_AActor_A_CustomRailgun(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    iVar12 = param[2].field_0.i;
    if (numparam == 3) {
      pVVar8 = defaultparam->Array;
      goto LAB_003cfc49;
    }
    if (param[3].field_0.field_3.Type != '\0') {
      pcVar11 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003d0890;
    }
    if ((uint)numparam < 5) {
      pVVar8 = defaultparam->Array;
      goto LAB_003cfc56;
    }
    if (param[4].field_0.field_3.Type != '\0') {
      pcVar11 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003d0840;
    }
    if (numparam == 5) {
      pVVar8 = defaultparam->Array;
      goto LAB_003cfc64;
    }
    if (param[5].field_0.field_3.Type != '\0') {
      pcVar11 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003d0821;
    }
    uVar10 = param[5].field_0.i;
    if ((uint)numparam < 7) {
      pVVar8 = defaultparam->Array;
      goto LAB_003cfc71;
    }
    if (param[6].field_0.field_3.Type != '\0') {
      pcVar11 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003d0802;
    }
    iVar13 = param[6].field_0.i;
    if (numparam == 7) {
      pVVar8 = defaultparam->Array;
      goto LAB_003cfc7f;
    }
    if (param[7].field_0.field_3.Type != '\x01') {
      pcVar11 = "(param[paramnum]).Type == REGT_FLOAT";
      goto LAB_003d07e3;
    }
    if ((uint)numparam < 9) {
      pVVar8 = defaultparam->Array;
      goto LAB_003cfc8e;
    }
    if ((param[8].field_0.field_3.Type != '\x03') ||
       (param[8].field_0.field_1.a != (void *)0x0 && param[8].field_0.field_1.atag != 1)) {
      pcVar11 = 
      "(param[paramnum]).Type == REGT_POINTER && ((param[paramnum]).atag == ATAG_OBJECT || (param[paramnum]).a == nullptr)"
      ;
      goto LAB_003d0666;
    }
    if (numparam == 9) {
      pVVar8 = defaultparam->Array;
      goto LAB_003cfcb7;
    }
    if (param[9].field_0.field_3.Type != '\x01') {
      pcVar11 = "(param[paramnum]).Type == REGT_FLOAT";
      goto LAB_003d07c4;
    }
    if ((uint)numparam < 0xb) {
      pVVar8 = defaultparam->Array;
      goto LAB_003cfccc;
    }
    if (param[10].field_0.field_3.Type != '\x01') {
      pcVar11 = "(param[paramnum]).Type == REGT_FLOAT";
      goto LAB_003d07a5;
    }
    if (numparam == 0xb) {
      pVVar8 = defaultparam->Array;
      goto LAB_003cfce1;
    }
    if (param[0xb].field_0.field_3.Type != '\x01') {
      pcVar11 = "(param[paramnum]).Type == REGT_FLOAT";
      goto LAB_003d0786;
    }
    uVar17 = (undefined4)*(undefined8 *)&param[0xb].field_0;
    uVar18 = (undefined4)((ulong)*(undefined8 *)&param[0xb].field_0 >> 0x20);
    if ((uint)numparam < 0xd) {
      pVVar8 = defaultparam->Array;
      goto LAB_003cfcf6;
    }
    if (param[0xc].field_0.field_3.Type != '\0') {
      pcVar11 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003d0767;
    }
    if (numparam == 0xd) {
      pVVar8 = defaultparam->Array;
      goto LAB_003cfd09;
    }
    if (param[0xd].field_0.field_3.Type != '\x01') {
      pcVar11 = "(param[paramnum]).Type == REGT_FLOAT";
      goto LAB_003d0748;
    }
    uVar19 = (undefined4)*(undefined8 *)&param[0xd].field_0;
    uVar20 = (undefined4)((ulong)*(undefined8 *)&param[0xd].field_0 >> 0x20);
    if ((uint)numparam < 0xf) {
      pVVar8 = defaultparam->Array;
      goto LAB_003cfd1e;
    }
    if (param[0xe].field_0.field_3.Type != '\x01') {
      pcVar11 = "(param[paramnum]).Type == REGT_FLOAT";
      goto LAB_003d0729;
    }
    if (numparam == 0xf) {
      pVVar8 = defaultparam->Array;
      goto LAB_003cfd33;
    }
    if ((param[0xf].field_0.field_3.Type != '\x03') ||
       (param[0xf].field_0.field_1.a != (void *)0x0 && param[0xf].field_0.field_1.atag != 1)) {
      pcVar11 = 
      "(param[paramnum]).Type == REGT_POINTER && ((param[paramnum]).atag == ATAG_OBJECT || (param[paramnum]).a == nullptr)"
      ;
      goto LAB_003d0647;
    }
    if ((uint)numparam < 0x11) {
      pVVar8 = defaultparam->Array;
      goto LAB_003cfd5c;
    }
    if (param[0x10].field_0.field_3.Type != '\x01') {
      pcVar11 = "(param[paramnum]).Type == REGT_FLOAT";
      goto LAB_003d070a;
    }
    if (numparam == 0x11) {
      pVVar8 = defaultparam->Array;
      goto LAB_003cfd71;
    }
    if (param[0x11].field_0.field_3.Type != '\0') {
      pcVar11 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003d06eb;
    }
    if ((uint)numparam < 0x13) {
      pVVar8 = defaultparam->Array;
      goto LAB_003cfd85;
    }
    if (param[0x12].field_0.field_3.Type != '\0') {
      pcVar11 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003d06cc;
    }
  }
  local_e8 = (other->__Pos).X;
  dStack_e0 = (other->__Pos).Y;
  local_118 = (other->__Pos).Z;
  local_140._0_8_ = (other->Angles).Yaw.Degrees;
  local_110 = (other->Angles).Pitch.Degrees;
  if (iVar13 != 0) {
    pAVar9 = (other->target).field_0.p;
    if (pAVar9 == (AActor *)0x0) {
      return 0;
    }
    if (((pAVar9->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
      (other->target).field_0.p = (AActor *)0x0;
      return 0;
    }
  }
  uVar15 = -(ulong)((double)CONCAT44(uVar18,uVar17) == 0.0);
  uVar16 = -(ulong)((double)CONCAT44(uVar20,uVar19) == 0.0);
  local_f8._0_8_ = ~uVar16 & CONCAT44(uVar20,uVar19);
  local_f8._8_8_ = 0;
  uVar5 = (other->flags).Value;
  if ((uVar5 >> 0x1e & 1) != 0) {
    other->visdir = '\x01';
  }
  local_108 = ~uVar15 & CONCAT44(uVar18,uVar17) | uVar15 & 0x40c0000000000000;
  local_f8 = local_f8 | ZEXT416((uint)(uVar16 >> 0x20) & 0x3ff00000) << 0x20;
  (other->flags).Value = uVar5 & 0xffffffdf;
  uStack_100 = 0;
  local_140._8_8_ = local_140._0_8_;
  if (iVar13 == 0) {
    pAVar9 = (AActor *)0x0;
  }
  else {
    pAVar9 = (other->target).field_0.p;
    if (pAVar9 == (AActor *)0x0) {
LAB_003cfeca:
      pAVar9 = (AActor *)0x0;
    }
    else if (((pAVar9->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
      (other->target).field_0.p = (AActor *)0x0;
      goto LAB_003cfeca;
    }
    AActor::AngleTo((AActor *)&xydiff,other,SUB81(pAVar9,0));
    (other->Angles).Yaw.Degrees = xydiff.X;
    local_140._0_8_ = xydiff.X;
    pAVar1 = (other->target).field_0.p;
    pAVar9 = (AActor *)0x0;
    if ((pAVar1 != (AActor *)0x0) &&
       (pAVar9 = (AActor *)0x0, ((pAVar1->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0)) {
      pAVar9 = pAVar1;
    }
  }
  local_148 = 0x404e000000000000;
  P_AimLineAttack((AActor *)&xydiff,(DAngle *)other,2048.0,(FTranslatedLineTarget *)local_140,
                  (DAngle *)&t,(int)&local_148,(AActor *)0x0,pAVar9);
  (other->Angles).Pitch.Degrees = xydiff.X;
  if ((iVar13 == 0) || (t.linetarget != (AActor *)0x0)) {
    if (iVar13 == 0) goto LAB_003d0244;
  }
  else {
    pAVar9 = (other->target).field_0.p;
    if ((pAVar9 != (AActor *)0x0) &&
       (((pAVar9->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
      (other->target).field_0.p = (AActor *)0x0;
    }
    AActor::Vec2To((AActor *)&xydiff,other);
    pAVar9 = (other->target).field_0.p;
    dVar2 = (other->__Pos).Z + other->Height * 0.5;
    unique0x10000690 = SUB84(dVar2,0);
    local_140._8_8_ = (((pAVar9->__Pos).Z + pAVar9->Height * 0.5) - dVar2) - other->Floorclip;
    unique0x10000694 = (int)((ulong)dVar2 >> 0x20);
    dVar2 = c_sqrt((double)CONCAT44(xydiff.Y._4_4_,xydiff.Y._0_4_) *
                   (double)CONCAT44(xydiff.Y._4_4_,xydiff.Y._0_4_) + xydiff.X * xydiff.X);
    dVar2 = c_atan2((double)local_140._8_8_,dVar2);
    (other->Angles).Pitch.Degrees = dVar2 * -57.29577951308232;
  }
  pAVar9 = (other->target).field_0.p;
  AActor::AngleTo((AActor *)&xydiff,other,(pAVar9->Vel).X * -3.0,(pAVar9->Vel).Y * -3.0,
                  SUB81(pAVar9,0));
  (other->Angles).Yaw.Degrees = xydiff.X;
  local_140._8_8_ = xydiff.X;
  if (iVar13 == 2) {
    local_120 = FFastTrig::cos(&fasttrig,xydiff.X * 11930464.711111112 + 6755399441055744.0);
    local_120 = local_120 * (double)iVar12;
    dVar2 = FFastTrig::sin(&fasttrig,
                           (other->Angles).Yaw.Degrees * 11930464.711111112 + 6755399441055744.0);
    P_GetOffsetPosition((other->__Pos).X,(other->__Pos).Y,local_120,(double)iVar12 * dVar2);
    (other->__Pos).X = xydiff.X;
    (other->__Pos).Y = (double)CONCAT44(xydiff.Y._4_4_,xydiff.Y._0_4_);
    pAVar9 = (other->target).field_0.p;
    AActor::AngleTo((AActor *)&xydiff,other,(pAVar9->Vel).X * -3.0,(pAVar9->Vel).Y * -3.0,
                    SUB81(pAVar9,0));
    (other->Angles).Yaw.Degrees = xydiff.X;
  }
  if (((((other->target).field_0.p)->flags).Value & 0x40000) != 0) {
    uVar5 = FRandom::GenRand32(&pr_crailgun);
    uVar6 = FRandom::GenRand32(&pr_crailgun);
    (other->Angles).Yaw.Degrees =
         (double)(int)((uVar5 & 0xff) - (uVar6 & 0xff)) * 0.17578125 + (other->Angles).Yaw.Degrees;
  }
LAB_003d0244:
  if ((uVar10 & 4) == 0) {
    FRandom::GenRand32(&pr_crailgun);
    FRandom::GenRand32(&pr_crailgun);
    FRandom::GenRand32(&pr_crailgun);
    FRandom::GenRand32(&pr_crailgun);
  }
  xydiff.X = (double)other;
  xydiff.Y._0_4_ = iVar4;
  P_RailAttack((FRailParams *)&xydiff);
  (other->__Pos).Z = local_118;
  (other->__Pos).X = local_e8;
  (other->__Pos).Y = dStack_e0;
  (other->Angles).Yaw.Degrees = (double)local_140._8_8_;
  (other->Angles).Pitch.Degrees = local_110;
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_CustomRailgun)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_INT		(damage);
	PARAM_INT_DEF	(spawnofs_xy)		
	PARAM_COLOR_DEF	(color1)			
	PARAM_COLOR_DEF	(color2)			
	PARAM_INT_DEF	(flags)				
	PARAM_INT_DEF	(aim)				
	PARAM_FLOAT_DEF	(maxdiff)			
	PARAM_CLASS_DEF	(pufftype, AActor)	
	PARAM_ANGLE_DEF	(spread_xy)			
	PARAM_ANGLE_DEF	(spread_z)			
	PARAM_FLOAT_DEF	(range)				
	PARAM_INT_DEF	(duration)			
	PARAM_FLOAT_DEF	(sparsity)			
	PARAM_FLOAT_DEF	(driftspeed)		
	PARAM_CLASS_DEF	(spawnclass, AActor)
	PARAM_FLOAT_DEF	(spawnofs_z)		
	PARAM_INT_DEF	(SpiralOffset)		
	PARAM_INT_DEF	(limit)				

	if (range == 0) range = 8192.;
	if (sparsity == 0) sparsity = 1;

	FTranslatedLineTarget t;

	DVector3 savedpos = self->Pos();
	DAngle saved_angle = self->Angles.Yaw;
	DAngle saved_pitch = self->Angles.Pitch;

	if (aim && self->target == NULL)
	{
		return 0;
	}
	// [RH] Andy Baker's stealth monsters
	if (self->flags & MF_STEALTH)
	{
		self->visdir = 1;
	}

	self->flags &= ~MF_AMBUSH;


	if (aim)
	{
		self->Angles.Yaw = self->AngleTo(self->target);
	}
	self->Angles.Pitch = P_AimLineAttack (self, self->Angles.Yaw, MISSILERANGE, &t, 60., 0, aim ? self->target : NULL);
	if (t.linetarget == NULL && aim)
	{
		// We probably won't hit the target, but aim at it anyway so we don't look stupid.
		DVector2 xydiff = self->Vec2To(self->target);
		double zdiff = self->target->Center() - self->Center() - self->Floorclip;
		self->Angles.Pitch = -VecToAngle(xydiff.Length(), zdiff);
	}
	// Let the aim trail behind the player
	if (aim)
	{
		saved_angle = self->Angles.Yaw = self->AngleTo(self->target, -self->target->Vel.X * 3, -self->target->Vel.Y * 3);

		if (aim == CRF_AIMDIRECT)
		{
			// Tricky: We must offset to the angle of the current position
			// but then change the angle again to ensure proper aim.
			self->SetXY(self->Vec2Offset(
				spawnofs_xy * self->Angles.Yaw.Cos(),
				spawnofs_xy * self->Angles.Yaw.Sin()));
			spawnofs_xy = 0;
			self->Angles.Yaw = self->AngleTo(self->target,- self->target->Vel.X * 3, -self->target->Vel.Y * 3);
		}

		if (self->target->flags & MF_SHADOW)
		{
			DAngle rnd = pr_crailgun.Random2() * (45. / 256.);
			self->Angles.Yaw += rnd;
		}
	}

	if (!(flags & CRF_EXPLICITANGLE))
	{
		spread_xy = spread_xy * pr_crailgun.Random2() / 255;
		spread_z = spread_z * pr_crailgun.Random2() / 255;
	}

	FRailParams p;
	p.source = self;
	p.damage = damage;
	p.offset_xy = spawnofs_xy;
	p.offset_z = spawnofs_z;
	p.color1 = color1;
	p.color2 = color2;
	p.maxdiff = maxdiff;
	p.flags = flags;
	p.puff = pufftype;
	p.angleoffset = spread_xy;
	p.pitchoffset = spread_z;
	p.distance = range;
	p.duration = duration;
	p.sparsity = sparsity;
	p.drift = driftspeed;
	p.spawnclass = spawnclass;
	p.SpiralOffset = SpiralOffset;
	p.limit = 0;
	P_RailAttack(&p);

	self->SetXYZ(savedpos);
	self->Angles.Yaw = saved_angle;
	self->Angles.Pitch = saved_pitch;
	return 0;
}